

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

Mvc_Cover_t * Mvc_CoverFlipVar(Mvc_Cover_t *p,int iValue0,int iValue1)

{
  byte bVar1;
  byte bVar2;
  Mvc_Cover_t *pCover_00;
  Mvc_Cube_t *pMVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  Mvc_List_t *pList;
  int Temp;
  int Value1;
  int Value0;
  Mvc_Cube_t *pCubeCopy;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover;
  int iValue1_local;
  int iValue0_local;
  Mvc_Cover_t *p_local;
  
  if (iValue0 + 1 != iValue1) {
    __assert_fail("iValue0 + 1 == iValue1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcUtils.c"
                  ,0x228,"Mvc_Cover_t *Mvc_CoverFlipVar(Mvc_Cover_t *, int, int)");
  }
  pCover_00 = Mvc_CoverClone(p);
  pCubeCopy = (p->lCubes).pHead;
  do {
    if (pCubeCopy == (Mvc_Cube_t *)0x0) {
      return pCover_00;
    }
    pMVar3 = Mvc_CubeDup(pCover_00,pCubeCopy);
    if ((pCover_00->lCubes).pHead == (Mvc_Cube_t *)0x0) {
      (pCover_00->lCubes).pHead = pMVar3;
    }
    else {
      ((pCover_00->lCubes).pTail)->pNext = pMVar3;
    }
    (pCover_00->lCubes).pTail = pMVar3;
    pMVar3->pNext = (Mvc_Cube_t *)0x0;
    (pCover_00->lCubes).nItems = (pCover_00->lCubes).nItems + 1;
    iVar4 = iValue0 >> 5;
    bVar1 = (byte)iValue0;
    bVar6 = (pMVar3->pData[iVar4] & 1 << (bVar1 & 0x1f)) == 0;
    iVar5 = iValue1 >> 5;
    bVar2 = (byte)iValue1;
    bVar7 = (pMVar3->pData[iVar5] & 1 << (bVar2 & 0x1f)) == 0;
    if ((bVar6) || (bVar7)) {
      if ((bVar6) && (bVar7)) {
        __assert_fail("Value0 || Value1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcUtils.c"
                      ,0x23a,"Mvc_Cover_t *Mvc_CoverFlipVar(Mvc_Cover_t *, int, int)");
      }
      if (bVar7) {
        pMVar3->pData[iVar4] = (1 << (bVar1 & 0x1f) ^ 0xffffffffU) & pMVar3->pData[iVar4];
      }
      else {
        pMVar3->pData[iVar4] = 1 << (bVar1 & 0x1f) | pMVar3->pData[iVar4];
      }
      if (bVar6) {
        pMVar3->pData[iVar5] = (1 << (bVar2 & 0x1f) ^ 0xffffffffU) & pMVar3->pData[iVar5];
      }
      else {
        pMVar3->pData[iVar5] = 1 << (bVar2 & 0x1f) | pMVar3->pData[iVar5];
      }
    }
    pCubeCopy = pCubeCopy->pNext;
  } while( true );
}

Assistant:

Mvc_Cover_t * Mvc_CoverFlipVar( Mvc_Cover_t * p, int iValue0, int iValue1 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    int Value0, Value1, Temp;

    assert( iValue0 + 1 == iValue1 ); // should be adjacent

    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        pCubeCopy = Mvc_CubeDup( pCover, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );

        // get the bits
        Value0 = Mvc_CubeBitValue( pCubeCopy, iValue0 );
        Value1 = Mvc_CubeBitValue( pCubeCopy, iValue1 );

        // if both bits are one, nothing to swap
        if ( Value0 && Value1 )
            continue;
        // cannot be both zero because they belong to the same var
        assert( Value0 || Value1 ); 

        // swap the bits
        Temp   = Value0;
        Value0 = Value1;
        Value1 = Temp;

        // set the bits after the swap
        if ( Value0 )
            Mvc_CubeBitInsert( pCubeCopy, iValue0 );
        else
            Mvc_CubeBitRemove( pCubeCopy, iValue0 );

        if ( Value1 )
            Mvc_CubeBitInsert( pCubeCopy, iValue1 );
        else
            Mvc_CubeBitRemove( pCubeCopy, iValue1 );
    }
    return pCover;
}